

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_ManFaultDumpNewFaults
              (Gia_Man_t *pM,int nFuncVars,Vec_Int_t *vTests,Vec_Int_t *vTestNew,Bmc_ParFf_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  sat_solver *s;
  Vec_Int_t *p;
  int *piVar3;
  long lVar4;
  abctime aVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  timespec ts;
  timespec local_78;
  Cnf_Dat_t *local_68;
  Gia_Man_t *local_60;
  int local_54;
  Gia_Man_t *local_50;
  Bmc_ParFf_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = pM;
  local_60 = Gia_ManFaultCofactor(pM,vTestNew);
  pAig = Gia_ManToAigSimple(local_60);
  pAig->nRegs = 0;
  local_68 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,1);
  iVar2 = pPars->nTimeOut;
  local_48 = pPars;
  if ((long)iVar2 == 0) {
    aVar5 = 0;
  }
  else {
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    aVar5 = lVar4 + (long)iVar2 * 1000000;
  }
  s->nRuntimeLimit = aVar5;
  Gia_ManFaultAddOne(local_50,(Cnf_Dat_t *)0x0,s,vTestNew,nFuncVars,1,(Gia_Man_t *)0x0);
  uVar9 = (long)vTests->nSize / (long)nFuncVars;
  if (vTests->nSize % nFuncVars != 0) {
    __assert_fail("Vec_IntSize(vTests) % nFuncVars == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x530,
                  "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                 );
  }
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0x10 < (uint)nFuncVars) {
    iVar2 = nFuncVars;
  }
  p->nSize = 0;
  p->nCap = iVar2;
  piVar3 = (int *)malloc((long)iVar2 << 2);
  p->pArray = piVar3;
  if (0 < (int)uVar9) {
    local_40 = (ulong)(uint)nFuncVars;
    uVar7 = 0;
    uVar6 = 0;
    local_54 = nFuncVars;
    local_38 = uVar9 & 0xffffffff;
    do {
      uVar10 = (ulong)uVar6;
      p->nSize = 0;
      uVar9 = local_40;
      if (0 < nFuncVars) {
        do {
          if (((int)uVar6 < 0) || (vTests->nSize <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(p,vTests->pArray[uVar10]);
          uVar10 = uVar10 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      nFuncVars = local_54;
      iVar2 = Gia_ManFaultAddOne(local_50,local_68,s,p,local_54,0,local_60);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x53c,
                      "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                     );
      }
      uVar7 = uVar7 + 1;
      uVar6 = uVar6 + nFuncVars;
    } while (uVar7 != local_38);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  uVar6 = Gia_ManDumpUntests(local_60,local_68,s,nFuncVars,"newfaults.txt",local_48->fVerbose);
  printf("Dumped %d new multiple faults into file \"%s\".  ",(ulong)uVar6,"newfaults.txt");
  iVar1 = 3;
  iVar2 = clock_gettime(3,&local_78);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar8 + lVar4) / 1000000.0);
  sat_solver_delete(s);
  Cnf_DataFree(local_68);
  Gia_ManStop(local_60);
  return 1;
}

Assistant:

int Gia_ManFaultDumpNewFaults( Gia_Man_t * pM, int nFuncVars, Vec_Int_t * vTests, Vec_Int_t * vTestNew, Bmc_ParFf_t * pPars )
{
    char * pFileName = "newfaults.txt";
    abctime clk;
    Gia_Man_t * pC;
    Cnf_Dat_t * pCnf2;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, Iter, IterMax, nNewFaults;

    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vTestNew );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );

    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    // create the first cofactor
    Gia_ManFaultAddOne( pM, NULL, pSat, vTestNew, nFuncVars, 1, NULL );

    // add other test patterns
    assert( Vec_IntSize(vTests) % nFuncVars == 0 );
    IterMax = Vec_IntSize(vTests) / nFuncVars;
    vLits = Vec_IntAlloc( nFuncVars );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        // get pattern
        Vec_IntClear( vLits );
        for ( i = 0; i < nFuncVars; i++ )
            Vec_IntPush( vLits, Vec_IntEntry(vTests, Iter*nFuncVars + i) );
        // the resulting problem cannot be UNSAT, because the new test is guaranteed 
        // to detect something that the given test set does not detect
        if ( !Gia_ManFaultAddOne( pM, pCnf2, pSat, vLits, nFuncVars, 0, pC ) )
            assert( 0 );
    }
    Vec_IntFree( vLits );

    // dump the new faults
    clk = Abc_Clock();
    nNewFaults = Gia_ManDumpUntests( pC, pCnf2, pSat, nFuncVars, pFileName, pPars->fVerbose );
    printf( "Dumped %d new multiple faults into file \"%s\".  ", nNewFaults, pFileName );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}